

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::InitializeStaticSRBResources
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,
          IShaderResourceBinding *pSRB)

{
  PipelineResourceSignatureGLImpl *pPVar1;
  char cVar2;
  ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this_00;
  char (*in_R8) [3];
  string msg;
  
  if (pSRB == (IShaderResourceBinding *)0x0) {
    FormatString<char[21]>(&msg,(char (*) [21])"SRB must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeStaticSRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x221);
    std::__cxx11::string::~string((string *)&msg);
  }
  this_00 = &ClassPtrCast<Diligent::ShaderResourceBindingGLImpl,Diligent::IShaderResourceBinding>
                       (pSRB)->super_ShaderResourceBindingBase<Diligent::EngineGLImplTraits>;
  if (this_00->m_bStaticResourcesInitialized == true) {
    FormatString<char[87]>
              (&msg,(char (*) [87])
                    "Static resources have already been initialized in this shader resource binding object."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    pPVar1 = (this_00->m_pPRS).m_pObject;
    cVar2 = (**(code **)((long)(pPVar1->
                               super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                               .super_ObjectBase<Diligent::IPipelineResourceSignature>.
                               super_RefCountedObject<Diligent::IPipelineResourceSignature>.
                               super_IPipelineResourceSignature.super_IDeviceObject.super_IObject +
                        0x78))(pPVar1,this);
    if (cVar2 == '\0') {
      FormatString<char[68],char_const*,char[3]>
                (&msg,(Diligent *)
                      "Shader resource binding is not compatible with resource signature \'",
                 (char (*) [68])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                  ).m_Desc,(char **)"\'.",in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"InitializeStaticSRBResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x22e);
      std::__cxx11::string::~string((string *)&msg);
    }
    PipelineResourceSignatureGLImpl::CopyStaticResources
              ((PipelineResourceSignatureGLImpl *)this,&this_00->m_ShaderResourceCache);
    ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::SetStaticResourcesInitialized(this_00);
  }
  return;
}

Assistant:

InitializeStaticSRBResources(IShaderResourceBinding* pSRB) const override final
    {
        DEV_CHECK_ERR(pSRB != nullptr, "SRB must not be null");

        ShaderResourceBindingImplType* const pSRBImpl = ClassPtrCast<ShaderResourceBindingImplType>(pSRB);
        if (pSRBImpl->StaticResourcesInitialized())
        {
            LOG_WARNING_MESSAGE("Static resources have already been initialized in this shader resource binding object.");
            return;
        }

        const PipelineResourceSignatureImplType* const pThisImpl = static_cast<const PipelineResourceSignatureImplType*>(this);
#ifdef DILIGENT_DEVELOPMENT
        {
            const IPipelineResourceSignature* pSRBSignature = pSRBImpl->GetPipelineResourceSignature();
            DEV_CHECK_ERR(pSRBSignature->IsCompatibleWith(pThisImpl), "Shader resource binding is not compatible with resource signature '", pThisImpl->m_Desc.Name, "'.");
        }
#endif

        auto& ResourceCache = pSRBImpl->GetResourceCache();
        pThisImpl->CopyStaticResources(ResourceCache);

        pSRBImpl->SetStaticResourcesInitialized();
    }